

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

ostream * pbrt::operator<<(ostream *os,
                          unique_ptr<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>
                          *p)

{
  PowerLightSampler *this;
  ostream *poVar1;
  string local_30;
  
  this = (p->_M_t).
         super___uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>
         ._M_t.
         super__Tuple_impl<0UL,_pbrt::PowerLightSampler_*,_std::default_delete<pbrt::PowerLightSampler>_>
         .super__Head_base<0UL,_pbrt::PowerLightSampler_*,_false>._M_head_impl;
  if (this != (PowerLightSampler *)0x0) {
    PowerLightSampler::ToString_abi_cxx11_(&local_30,this);
    poVar1 = std::operator<<(os,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return poVar1;
  }
  poVar1 = std::operator<<(os,"(nullptr)");
  return poVar1;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const std::unique_ptr<T> &p) {
    if (p)
        return os << p->ToString();
    else
        return os << "(nullptr)";
}